

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.hpp
# Opt level: O1

shared_ptr<int> __thiscall
strq::Generator<std::shared_ptr<int>,void>::operator()
          (Generator<std::shared_ptr<int>,void> *this,
          Compound<strq::Arithmetic<strq::detail::NoDistribution>_> *schema)

{
  int iVar1;
  int *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<int> sVar2;
  Generator<int,void> local_11;
  
  __p = (int *)operator_new(4);
  iVar1 = Generator<int,void>::operator()(&local_11);
  *__p = iVar1;
  *(int **)this = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),__p);
  sVar2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<int>)sVar2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

auto operator() (Schema&& schema) -> T
        {
            return T {new typename T::element_type {
                    random<typename T::element_type>(std::get<0>(schema.values()))
            }};
        }